

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O0

void * noise_new(void)

{
  t_object *owner;
  t_symbol *s;
  t_noise *x;
  
  owner = (t_object *)pd_new(noise_class);
  noise_new::init = noise_new::init * 0x527;
  *(int *)&owner[1].te_g.g_pd = noise_new::init;
  s = gensym("signal");
  outlet_new(owner,s);
  return owner;
}

Assistant:

static void *noise_new(void)
{
    t_noise *x = (t_noise *)pd_new(noise_class);
        /* seed each instance differently.  Once in a blue moon two threads
        could grab the same seed value.  We can live with that. */
    static int init = 307;
    x->x_val = (init *= 1319);
    outlet_new(&x->x_obj, gensym("signal"));
    return (x);
}